

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

void __thiscall icu_63::Package::readPackage(Package *this,char *filename)

{
  FILE *__stream;
  int32_t *piVar1;
  UDataSwapper *pUVar2;
  UBool UVar3;
  char cVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint8_t *puVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  int32_t *piVar14;
  char *pcVar15;
  bool bVar16;
  int32_t inPkgNameLength;
  char *prefixLimit;
  int32_t prefixLength;
  int32_t stringsOffset;
  char *inItemStrings;
  char *s;
  char prefix [68];
  UDataOffsetTOCEntry *inEntries;
  int iStack_48;
  char type;
  int32_t typeEnum;
  int32_t itemLength;
  int32_t i;
  int32_t offset;
  int32_t length;
  uint8_t *inBytes;
  uint8_t *puStack_28;
  UErrorCode errorCode;
  UDataInfo *pInfo;
  UDataSwapper *ds;
  char *filename_local;
  Package *this_local;
  
  ds = (UDataSwapper *)filename;
  filename_local = this->inPkgName;
  extractPackageName(filename,this->inPkgName,0x40);
  puVar10 = readFile((char *)0x0,&ds->inIsBigEndian,&this->inLength,(char *)((long)&inEntries + 3));
  this->inData = puVar10;
  i = this->inLength;
  inBytes._4_4_ = U_ZERO_ERROR;
  makeTypeProps(inEntries._3_1_,&this->inCharset,&this->inIsBigEndian);
  pInfo = (UDataInfo *)
          udata_openSwapper_63
                    (this->inIsBigEndian,this->inCharset,'\0','\0',
                     (UErrorCode *)((long)&inBytes + 4));
  UVar3 = ::U_FAILURE(inBytes._4_4_);
  pUVar2 = ds;
  __stream = _stderr;
  if (UVar3 != '\0') {
    pcVar11 = u_errorName_63(inBytes._4_4_);
    fprintf(__stream,"icupkg: udata_openSwapper(\"%s\") failed - %s\n",pUVar2,pcVar11);
    exit(inBytes._4_4_);
  }
  *(code **)(pInfo + 4) = printPackageError;
  *(FILE **)pInfo[4].dataFormat = _stderr;
  this->headerLength = 0x400;
  if (i < this->headerLength) {
    this->headerLength = i;
  }
  iVar5 = udata_swapDataHeader_63
                    ((UDataSwapper *)pInfo,this->inData,this->headerLength,this->header,
                     (UErrorCode *)((long)&inBytes + 4));
  this->headerLength = iVar5;
  UVar3 = ::U_FAILURE(inBytes._4_4_);
  if (UVar3 != '\0') {
    exit(inBytes._4_4_);
  }
  puVar10 = this->inData;
  puStack_28 = puVar10 + 4;
  if ((((puVar10[0xc] != 'C') || (puVar10[0xd] != 'm')) || (puVar10[0xe] != 'n')) ||
     ((puVar10[0xf] != 'D' || (puVar10[0x10] != '\x01')))) {
    fprintf(_stderr,
            "icupkg: data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as an ICU .dat package\n"
            ,(ulong)puVar10[0xc],(ulong)puVar10[0xd],(ulong)puVar10[0xe],(ulong)puVar10[0xf],
            (uint)puVar10[0x10]);
    exit(0x10);
  }
  this->inIsBigEndian = puVar10[8];
  this->inCharset = puVar10[9];
  piVar14 = (int32_t *)(this->inData + this->headerLength);
  i = i - this->headerLength;
  _offset = piVar14;
  if (i < 4) {
    itemLength = 0x7fffffff;
  }
  else {
    iVar5 = udata_readInt32_63((UDataSwapper *)pInfo,*piVar14);
    this->itemCount = iVar5;
    setItemCapacity(this,this->itemCount);
    if (this->itemCount == 0) {
      itemLength = 4;
    }
    else if (i < this->itemCount * 8 + 4) {
      itemLength = 0x7fffffff;
    }
    else {
      iVar6 = (**(code **)pInfo->dataVersion)(piVar14[(long)(this->itemCount + -1) * 2 + 2]);
      itemLength = iVar6 + 0x14;
    }
  }
  if (i < itemLength) {
    fprintf(_stderr,"icupkg: too few bytes (%ld after header) for a .dat package\n",(long)i);
    exit(8);
  }
  if (this->itemCount < 1) {
    if (this->doAutoPrefix != '\0') {
      fprintf(_stderr,"icupkg: --auto_toc_prefix[_with_type] but the input package is empty\n");
      exit(3);
    }
  }
  else {
    if (this->itemMax < this->itemCount) {
      fprintf(_stderr,"icupkg: too many items, maximum is %d\n",(ulong)(uint)this->itemMax);
      exit(0xf);
    }
    iVar6 = this->itemCount * 8 + 4;
    iStack_48 = (**(code **)pInfo->dataVersion)(piVar14[2]);
    iStack_48 = iStack_48 - iVar6;
    while( true ) {
      bVar16 = false;
      if (0 < iStack_48) {
        bVar16 = *(char *)((long)_offset + (long)(iVar6 + iStack_48 + -1)) != '\0';
      }
      if (!bVar16) break;
      iStack_48 = iStack_48 + -1;
    }
    if (100000 < this->inStringTop + iStack_48) {
      fprintf(_stderr,"icupkg: total length of item name strings too long\n");
      exit(0xf);
    }
    pcVar11 = this->inStrings + this->inStringTop;
    (**(code **)pInfo[3].formatVersion)
              (pInfo,(long)_offset + (long)iVar6,iStack_48,pcVar11,(long)&inBytes + 4);
    UVar3 = ::U_FAILURE(inBytes._4_4_);
    if (UVar3 != '\0') {
      fprintf(_stderr,"icupkg failed to swap the input .dat package item name strings\n");
      exit(3);
    }
    this->inStringTop = iStack_48 + this->inStringTop;
    memset(this->items,0,(long)this->itemCount * 0x18);
    iVar7 = (**(code **)pInfo->dataVersion)(piVar14[1]);
    itemLength = iVar7 - iVar6;
    pcVar15 = pcVar11 + itemLength;
    if (this->doAutoPrefix == '\0') {
      sVar13 = strlen(this->inPkgName);
      iVar7 = (int)sVar13;
      memcpy(&s,this,(long)iVar7);
      sVar13 = strlen(pcVar15);
      if ((((int)sVar13 < iVar7 + 2) || (iVar8 = memcmp(pcVar15,this,(long)iVar7), iVar8 != 0)) ||
         (pcVar15[iVar7] != '_')) {
        prefix[(long)iVar7 + -8] = '/';
      }
      else {
        prefix[(long)iVar7 + -8] = '_';
      }
      prefixLimit._0_4_ = iVar7 + 1;
    }
    else {
      pcVar12 = strchr(pcVar15,0x2f);
      if (pcVar12 == (char *)0x0) {
        fprintf(_stderr,
                "icupkg: --auto_toc_prefix[_with_type] but the first entry \"%s\" does not contain a \'%c\'\n"
                ,pcVar15,0x2f);
        exit(3);
      }
      iVar7 = (int)pcVar12 - (int)pcVar15;
      if ((iVar7 == 0) || (0x3f < iVar7)) {
        fprintf(_stderr,
                "icupkg: --auto_toc_prefix[_with_type] but the prefix of the first entry \"%s\" is empty or too long\n"
                ,pcVar15);
        exit(3);
      }
      if ((this->prefixEndsWithType != '\0') && (pcVar15[iVar7 + -1] != inEntries._3_1_)) {
        fprintf(_stderr,
                "icupkg: --auto_toc_prefix_with_type but the prefix of the first entry \"%s\" does not end with \'%c\'\n"
                ,pcVar15,(ulong)(uint)(int)inEntries._3_1_);
        exit(3);
      }
      memcpy(this->pkgPrefix,pcVar15,(long)iVar7);
      this->pkgPrefix[iVar7] = '\0';
      prefixLimit._0_4_ = iVar7 + 1;
      memcpy(&s,pcVar15,(long)(int)prefixLimit);
    }
    prefix[(long)(int)prefixLimit + -8] = '\0';
    for (typeEnum = 0; iVar5 = i, typeEnum < this->itemCount; typeEnum = typeEnum + 1) {
      iVar7 = (**(code **)pInfo->dataVersion)((piVar14 + 1)[(long)typeEnum * 2]);
      itemLength = iVar7 - iVar6;
      pcVar15 = pcVar11 + itemLength;
      iVar7 = strncmp(pcVar15,(char *)&s,(long)(int)prefixLimit);
      piVar1 = _offset;
      if ((iVar7 != 0) || (pcVar15[(int)prefixLimit] == '\0')) {
        fprintf(_stderr,"icupkg: input .dat item name \"%s\" does not start with \"%s\"\n",pcVar15,
                &s);
        exit(3);
      }
      this->items[typeEnum].name = pcVar15 + (int)prefixLimit;
      uVar9 = (**(code **)pInfo->dataVersion)(piVar14[(long)typeEnum * 2 + 2]);
      this->items[typeEnum].data = (uint8_t *)((long)piVar1 + (ulong)uVar9);
      if (0 < typeEnum) {
        this->items[typeEnum + -1].length =
             (int)this->items[typeEnum].data - (int)this->items[typeEnum + -1].data;
        inEntries._4_4_ =
             getTypeEnumForInputData
                       (this->items[typeEnum + -1].data,this->items[typeEnum + -1].length,
                        (UErrorCode *)((long)&inBytes + 4));
        if ((inEntries._4_4_ < 0) || (UVar3 = ::U_FAILURE(inBytes._4_4_), UVar3 != '\0')) {
          fprintf(_stderr,"icupkg: not an ICU data file: item \"%s\" in \"%s\"\n",
                  this->items[typeEnum + -1].name,ds);
          exit(3);
        }
        cVar4 = makeTypeLetter(inEntries._4_4_);
        this->items[typeEnum + -1].type = cVar4;
      }
      this->items[typeEnum].isDataOwned = '\0';
    }
    iVar6 = (**(code **)pInfo->dataVersion)(piVar14[(long)(this->itemCount + -1) * 2 + 2]);
    this->items[this->itemCount + -1].length = iVar5 - iVar6;
    inEntries._4_4_ =
         getTypeEnumForInputData
                   (this->items[this->itemCount + -1].data,this->items[this->itemCount + -1].length,
                    (UErrorCode *)((long)&inBytes + 4));
    if ((inEntries._4_4_ < 0) || (UVar3 = ::U_FAILURE(inBytes._4_4_), UVar3 != '\0')) {
      fprintf(_stderr,"icupkg: not an ICU data file: item \"%s\" in \"%s\"\n",
              this->items[this->itemCount + -1].name,ds);
      exit(3);
    }
    cVar4 = makeTypeLetter(inEntries._4_4_);
    this->items[this->itemCount + -1].type = cVar4;
    if (inEntries._3_1_ != 'l') {
      sortItems(this);
    }
  }
  udata_closeSwapper_63((UDataSwapper *)pInfo);
  return;
}

Assistant:

void
Package::readPackage(const char *filename) {
    UDataSwapper *ds;
    const UDataInfo *pInfo;
    UErrorCode errorCode;

    const uint8_t *inBytes;

    int32_t length, offset, i;
    int32_t itemLength, typeEnum;
    char type;

    const UDataOffsetTOCEntry *inEntries;

    extractPackageName(filename, inPkgName, (int32_t)sizeof(inPkgName));

    /* read the file */
    inData=readFile(NULL, filename, inLength, type);
    length=inLength;

    /*
     * swap the header - even if the swapping itself is a no-op
     * because it tells us the header length
     */
    errorCode=U_ZERO_ERROR;
    makeTypeProps(type, inCharset, inIsBigEndian);
    ds=udata_openSwapper(inIsBigEndian, inCharset, U_IS_BIG_ENDIAN, U_CHARSET_FAMILY, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                filename, u_errorName(errorCode));
        exit(errorCode);
    }

    ds->printError=printPackageError;
    ds->printErrorContext=stderr;

    headerLength=sizeof(header);
    if(length<headerLength) {
        headerLength=length;
    }
    headerLength=udata_swapDataHeader(ds, inData, headerLength, header, &errorCode);
    if(U_FAILURE(errorCode)) {
        exit(errorCode);
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x43 &&   /* dataFormat="CmnD" */
        pInfo->dataFormat[1]==0x6d &&
        pInfo->dataFormat[2]==0x6e &&
        pInfo->dataFormat[3]==0x44 &&
        pInfo->formatVersion[0]==1
    )) {
        fprintf(stderr, "icupkg: data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as an ICU .dat package\n",
                pInfo->dataFormat[0], pInfo->dataFormat[1],
                pInfo->dataFormat[2], pInfo->dataFormat[3],
                pInfo->formatVersion[0]);
        exit(U_UNSUPPORTED_ERROR);
    }
    inIsBigEndian=(UBool)pInfo->isBigEndian;
    inCharset=pInfo->charsetFamily;

    inBytes=(const uint8_t *)inData+headerLength;
    inEntries=(const UDataOffsetTOCEntry *)(inBytes+4);

    /* check that the itemCount fits, then the ToC table, then at least the header of the last item */
    length-=headerLength;
    if(length<4) {
        /* itemCount does not fit */
        offset=0x7fffffff;
    } else {
        itemCount=udata_readInt32(ds, *(const int32_t *)inBytes);
        setItemCapacity(itemCount); /* resize so there's space */
        if(itemCount==0) {
            offset=4;
        } else if(length<(4+8*itemCount)) {
            /* ToC table does not fit */
            offset=0x7fffffff;
        } else {
            /* offset of the last item plus at least 20 bytes for its header */
            offset=20+(int32_t)ds->readUInt32(inEntries[itemCount-1].dataOffset);
        }
    }
    if(length<offset) {
        fprintf(stderr, "icupkg: too few bytes (%ld after header) for a .dat package\n",
                        (long)length);
        exit(U_INDEX_OUTOFBOUNDS_ERROR);
    }
    /* do not modify the package length variable until the last item's length is set */

    if(itemCount<=0) {
        if(doAutoPrefix) {
            fprintf(stderr, "icupkg: --auto_toc_prefix[_with_type] but the input package is empty\n");
            exit(U_INVALID_FORMAT_ERROR);
        }
    } else {
        char prefix[MAX_PKG_NAME_LENGTH+4];
        char *s, *inItemStrings;

        if(itemCount>itemMax) {
            fprintf(stderr, "icupkg: too many items, maximum is %d\n", itemMax);
            exit(U_BUFFER_OVERFLOW_ERROR);
        }

        /* swap the item name strings */
        int32_t stringsOffset=4+8*itemCount;
        itemLength=(int32_t)(ds->readUInt32(inEntries[0].dataOffset))-stringsOffset;

        // don't include padding bytes at the end of the item names
        while(itemLength>0 && inBytes[stringsOffset+itemLength-1]!=0) {
            --itemLength;
        }

        if((inStringTop+itemLength)>STRING_STORE_SIZE) {
            fprintf(stderr, "icupkg: total length of item name strings too long\n");
            exit(U_BUFFER_OVERFLOW_ERROR);
        }

        inItemStrings=inStrings+inStringTop;
        ds->swapInvChars(ds, inBytes+stringsOffset, itemLength, inItemStrings, &errorCode);
        if(U_FAILURE(errorCode)) {
            fprintf(stderr, "icupkg failed to swap the input .dat package item name strings\n");
            exit(U_INVALID_FORMAT_ERROR);
        }
        inStringTop+=itemLength;

        // reset the Item entries
        memset(items, 0, itemCount*sizeof(Item));

        /*
         * Get the common prefix of the items.
         * New-style ICU .dat packages use tree separators ('/') between package names,
         * tree names, and item names,
         * while old-style ICU .dat packages (before multi-tree support)
         * use an underscore ('_') between package and item names.
         */
        offset=(int32_t)ds->readUInt32(inEntries[0].nameOffset)-stringsOffset;
        s=inItemStrings+offset;  // name of the first entry
        int32_t prefixLength;
        if(doAutoPrefix) {
            // Use the first entry's prefix. Must be a new-style package.
            const char *prefixLimit=strchr(s, U_TREE_ENTRY_SEP_CHAR);
            if(prefixLimit==NULL) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix[_with_type] but "
                        "the first entry \"%s\" does not contain a '%c'\n",
                        s, U_TREE_ENTRY_SEP_CHAR);
                exit(U_INVALID_FORMAT_ERROR);
            }
            prefixLength=(int32_t)(prefixLimit-s);
            if(prefixLength==0 || prefixLength>=UPRV_LENGTHOF(pkgPrefix)) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix[_with_type] but "
                        "the prefix of the first entry \"%s\" is empty or too long\n",
                        s);
                exit(U_INVALID_FORMAT_ERROR);
            }
            if(prefixEndsWithType && s[prefixLength-1]!=type) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix_with_type but "
                        "the prefix of the first entry \"%s\" does not end with '%c'\n",
                        s, type);
                exit(U_INVALID_FORMAT_ERROR);
            }
            memcpy(pkgPrefix, s, prefixLength);
            pkgPrefix[prefixLength]=0;
            memcpy(prefix, s, ++prefixLength);  // include the /
        } else {
            // Use the package basename as prefix.
            int32_t inPkgNameLength= static_cast<int32_t>(strlen(inPkgName));
            memcpy(prefix, inPkgName, inPkgNameLength);
            prefixLength=inPkgNameLength;

            if( (int32_t)strlen(s)>=(inPkgNameLength+2) &&
                0==memcmp(s, inPkgName, inPkgNameLength) &&
                s[inPkgNameLength]=='_'
            ) {
                // old-style .dat package
                prefix[prefixLength++]='_';
            } else {
                // new-style .dat package
                prefix[prefixLength++]=U_TREE_ENTRY_SEP_CHAR;
                // if it turns out to not contain U_TREE_ENTRY_SEP_CHAR
                // then the test in the loop below will fail
            }
        }
        prefix[prefixLength]=0;

        /* read the ToC table */
        for(i=0; i<itemCount; ++i) {
            // skip the package part of the item name, error if it does not match the actual package name
            // or if nothing follows the package name
            offset=(int32_t)ds->readUInt32(inEntries[i].nameOffset)-stringsOffset;
            s=inItemStrings+offset;
            if(0!=strncmp(s, prefix, prefixLength) || s[prefixLength]==0) {
                fprintf(stderr, "icupkg: input .dat item name \"%s\" does not start with \"%s\"\n",
                        s, prefix);
                exit(U_INVALID_FORMAT_ERROR);
            }
            items[i].name=s+prefixLength;

            // set the item's data
            items[i].data=(uint8_t *)inBytes+ds->readUInt32(inEntries[i].dataOffset);
            if(i>0) {
                items[i-1].length=(int32_t)(items[i].data-items[i-1].data);

                // set the previous item's platform type
                typeEnum=getTypeEnumForInputData(items[i-1].data, items[i-1].length, &errorCode);
                if(typeEnum<0 || U_FAILURE(errorCode)) {
                    fprintf(stderr, "icupkg: not an ICU data file: item \"%s\" in \"%s\"\n", items[i-1].name, filename);
                    exit(U_INVALID_FORMAT_ERROR);
                }
                items[i-1].type=makeTypeLetter(typeEnum);
            }
            items[i].isDataOwned=FALSE;
        }
        // set the last item's length
        items[itemCount-1].length=length-ds->readUInt32(inEntries[itemCount-1].dataOffset);

        // set the last item's platform type
        typeEnum=getTypeEnumForInputData(items[itemCount-1].data, items[itemCount-1].length, &errorCode);
        if(typeEnum<0 || U_FAILURE(errorCode)) {
            fprintf(stderr, "icupkg: not an ICU data file: item \"%s\" in \"%s\"\n", items[itemCount-1].name, filename);
            exit(U_INVALID_FORMAT_ERROR);
        }
        items[itemCount-1].type=makeTypeLetter(typeEnum);

        if(type!=U_ICUDATA_TYPE_LETTER[0]) {
            // sort the item names for the local charset
            sortItems();
        }
    }

    udata_closeSwapper(ds);
}